

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_writer.cpp
# Opt level: O0

void __thiscall IsoWriter::writeLogicalVolumeIntegrityDescriptor(IsoWriter *this)

{
  short sVar1;
  uint32_t tagLocation;
  int iVar2;
  char *pcVar3;
  size_t __n;
  uint16_t *buff16;
  uint32_t *buff32;
  IsoWriter *this_local;
  
  memset(this->m_buffer,0,0x800);
  tagLocation = absoluteSectorNum(this);
  anon_unknown.dwarf_b4dde::writeDescriptorTag(this->m_buffer,LogicalVolIntegrity,tagLocation);
  anon_unknown.dwarf_b4dde::writeTimestamp(this->m_buffer + 0x10,this->m_currentTime);
  this->m_buffer[0x1c] = '\x01';
  this->m_buffer[0x1d] = '\0';
  this->m_buffer[0x1e] = '\0';
  this->m_buffer[0x1f] = '\0';
  this->m_buffer[0x24] = '\0';
  this->m_buffer[0x25] = '\0';
  this->m_buffer[0x26] = '\0';
  this->m_buffer[0x27] = '\0';
  this->m_buffer[0x20] = '\0';
  this->m_buffer[0x21] = '\0';
  this->m_buffer[0x22] = '\0';
  this->m_buffer[0x23] = '\0';
  *(uint *)(this->m_buffer + 0x28) = (uint)this->m_objectUniqId;
  this->m_buffer[0x2c] = '\0';
  this->m_buffer[0x2d] = '\0';
  this->m_buffer[0x2e] = '\0';
  this->m_buffer[0x2f] = '\0';
  this->m_buffer[0x48] = '\x02';
  this->m_buffer[0x49] = '\0';
  this->m_buffer[0x4a] = '\0';
  this->m_buffer[0x4b] = '\0';
  iVar2 = std::__cxx11::string::size();
  *(int *)(this->m_buffer + 0x4c) = iVar2 + 0x2e;
  this->m_buffer[0x54] = '\0';
  this->m_buffer[0x55] = '\0';
  this->m_buffer[0x56] = '\0';
  this->m_buffer[0x57] = '\0';
  this->m_buffer[0x50] = '\0';
  this->m_buffer[0x51] = '\0';
  this->m_buffer[0x52] = '\0';
  this->m_buffer[0x53] = '\0';
  *(int *)(this->m_buffer + 0x58) = this->m_partitionEndAddress - this->m_partitionStartAddress;
  *(int *)(this->m_buffer + 0x5c) = this->m_metadataFileLen / 0x800;
  pcVar3 = (char *)std::__cxx11::string::c_str();
  strcpy((char *)(this->m_buffer + 0x61),pcVar3);
  *(uint32_t *)(this->m_buffer + 0x80) = this->m_totalFiles;
  __n = (size_t)this->m_totalDirectories;
  *(uint32_t *)(this->m_buffer + 0x84) = this->m_totalDirectories;
  this->m_buffer[0x88] = 'P';
  this->m_buffer[0x89] = '\x02';
  this->m_buffer[0x8a] = 'P';
  this->m_buffer[0x8b] = '\x02';
  this->m_buffer[0x8c] = 'P';
  this->m_buffer[0x8d] = '\x02';
  pcVar3 = (char *)std::__cxx11::string::c_str();
  strcpy((char *)(this->m_buffer + 0x8e),pcVar3);
  sVar1 = std::__cxx11::string::size();
  anon_unknown.dwarf_b4dde::calcDescriptorCRC(this->m_buffer,sVar1 + 0x8e);
  File::write(&this->m_file,(int)this + 0xa0,(void *)0x800,__n);
  return;
}

Assistant:

void IsoWriter::writeLogicalVolumeIntegrityDescriptor()
{
    memset(m_buffer, 0, sizeof(m_buffer));
    writeDescriptorTag(m_buffer, DescriptorTag::LogicalVolIntegrity, absoluteSectorNum());

    const auto buff32 = reinterpret_cast<uint32_t *>(m_buffer);
    const auto buff16 = reinterpret_cast<uint16_t *>(m_buffer);

    writeTimestamp(m_buffer + 16, m_currentTime);
    buff32[7] = 0x01;              // Integrity Type
    buff32[8] = buff32[9] = 0x00;  // Next Integrity Extent
    // Logical Volume Contents Use (32 bytes)
    buff32[10] = m_objectUniqId;
    buff32[11] = 0;  // uniq ID hi

    buff32[72 / 4] = 0x02;                                             // Number of Partitions
    buff32[76 / 4] = static_cast<uint32_t>(46 + m_appId.size());       // Length of Implementation Use
    buff32[80 / 4] = buff32[84 / 4] = 0;                               // Free Space Table
    buff32[88 / 4] = m_partitionEndAddress - m_partitionStartAddress;  // main partition size
    buff32[92 / 4] = m_metadataFileLen / SECTOR_SIZE;

    strcpy(reinterpret_cast<char *>(m_buffer) + 97, m_impId.c_str());

    buff32[0x80 / 4] = m_totalFiles;
    buff32[0x84 / 4] = m_totalDirectories;
    buff16[0x88 / 2] = 0x0250;  // Minimum UDF Read Revision
    buff16[0x8a / 2] = 0x0250;  // Minimum UDF Write Revision
    buff16[0x8c / 2] = 0x0250;  // Maximum UDF Write Revision

    strcpy(reinterpret_cast<char *>(m_buffer) + 142, m_appId.c_str());

    calcDescriptorCRC(m_buffer, static_cast<uint16_t>(142 + m_appId.size()));
    m_file.write(m_buffer, SECTOR_SIZE);
}